

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forestdb.cc
# Opt level: O0

fdb_status fdb_set_daemon_compaction_interval(fdb_file_handle *fhandle,size_t interval)

{
  long *in_RDI;
  fdb_kvs_handle *handle;
  size_t in_stack_00000528;
  filemgr *in_stack_00000530;
  undefined4 local_4;
  
  if ((in_RDI == (long *)0x0) || (*in_RDI == 0)) {
    local_4 = FDB_RESULT_INVALID_HANDLE;
  }
  else if (*(char *)(*in_RDI + 0x9e) == '\x01') {
    local_4 = compactor_set_compaction_interval(in_stack_00000530,in_stack_00000528);
  }
  else {
    local_4 = FDB_RESULT_INVALID_CONFIG;
  }
  return local_4;
}

Assistant:

LIBFDB_API
fdb_status fdb_set_daemon_compaction_interval(fdb_file_handle *fhandle,
                                              size_t interval)
{
    if (!fhandle || !fhandle->root) {
        return FDB_RESULT_INVALID_HANDLE;
    }

    fdb_kvs_handle *handle = fhandle->root;

    if (handle->config.compaction_mode == FDB_COMPACTION_AUTO) {
        return compactor_set_compaction_interval(handle->file, interval);
    } else {
        return FDB_RESULT_INVALID_CONFIG;
    }
}